

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::getMergedDnaSequence
          (AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  shared_count *psVar2;
  pointer pCVar3;
  pointer pcVar4;
  iterator __position;
  pointer pmVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  size_type sVar13;
  int iVar14;
  char *__end;
  uint uVar15;
  int iVar16;
  int iVar17;
  _Alloc_hider _Var18;
  AlignmentRecord *pAVar19;
  char *pcVar20;
  int ref_s_pos2;
  int ref_s_pos1;
  int c_pos1;
  int q_pos1;
  AlignmentRecord *local_238;
  int c_pos2;
  int q_pos2;
  AlignmentRecord *local_228;
  undefined1 local_21c [4];
  string qualities;
  vector<char,_std::allocator<char>_> cigar_temp_unrolled;
  string dna;
  string nucigar;
  ShortDnaSequence local_198;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref;
  vector<char,_std::allocator<char>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  local_238 = (AlignmentRecord *)alignment;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dna,"","");
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&qualities,"","");
  nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar);
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar20 = (char *)(local_238->al_sequence1)._M_string_length;
  pcVar12 = (char *)(local_238->al_sequence1).field_2._M_allocated_capacity;
  if (pcVar20 != pcVar12) {
    do {
      if (*(int *)(pcVar20 + 4) != 0) {
        uVar15 = 0;
        do {
          if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&cigar_temp_unrolled,
                       (iterator)
                       cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,pcVar20);
          }
          else {
            *cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = *pcVar20;
            cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(uint *)(pcVar20 + 4));
      }
      pcVar20 = pcVar20 + 8;
    } while (pcVar20 != pcVar12);
  }
  pcVar20 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar12 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar14 = 0;
  iVar16 = 0;
  if (pcVar20 != pcVar12) {
    iVar16 = 0;
    do {
      pcVar11 = pcVar20 + 1;
      if ((*pcVar20 == 'S') || (bVar6 = true, *pcVar20 == 'H')) {
        iVar16 = iVar16 + 1;
        bVar6 = false;
      }
    } while ((!bVar6) && (pcVar20 = pcVar11, pcVar11 != pcVar12));
  }
  this_00 = &this->cigar1_unrolled;
  if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar14 = 0;
    pcVar20 = cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pcVar12 = pcVar20 + 1;
      if ((*pcVar20 == 'S') || (bVar6 = true, *pcVar20 == 'H')) {
        iVar14 = iVar14 + 1;
        bVar6 = false;
      }
    } while ((!bVar6) &&
            (pcVar20 = pcVar12,
            pcVar12 !=
            cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish));
  }
  iVar7 = computeRevOffset(this_00);
  iVar8 = computeRevOffset(&cigar_temp_unrolled);
  iVar16 = this->start1 - iVar16;
  iVar7 = iVar7 + this->end1;
  iVar17 = (*(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4) - iVar14) + 1;
  pAVar19 = local_238;
  ref_s_pos2 = iVar17;
  ref_s_pos1 = iVar16;
  local_228 = this;
  iVar14 = BamTools::BamAlignment::GetEndPosition(SUB81(local_238,0),false);
  iVar14 = iVar14 + iVar8;
  q_pos1 = 0;
  q_pos2 = 0;
  c_pos1 = 0;
  c_pos2 = 0;
  if ((iVar17 < iVar16) || (iVar14 < iVar7)) {
    if ((iVar17 < iVar16) || (iVar7 < iVar14)) {
      if ((iVar16 < iVar17) || (iVar14 < iVar7)) {
        while (ref_s_pos2 < iVar16) {
          noOverlapMerge((AlignmentRecord *)&q_pos2,(BamAlignment *)local_238,&dna,&qualities,
                         &nucigar,&cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar14) {
          overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar7) {
          noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,1);
        }
      }
      else {
        local_21c = (undefined1  [4])iVar14;
        while (ref_s_pos2 < iVar16) {
          noOverlapMerge(pAVar19,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= iVar7) {
          pAVar19 = local_228;
          overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                       &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos2);
        }
        while (ref_s_pos2 <= (int)local_21c) {
          noOverlapMerge(pAVar19,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                         &cigar_temp_unrolled,&c_pos2,&q_pos2,&ref_s_pos2);
        }
      }
    }
    else {
      while (ref_s_pos1 < iVar17) {
        noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
      while (ref_s_pos1 <= iVar14) {
        overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,
                     &cigar_temp_unrolled,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
      }
      while (ref_s_pos1 <= iVar7) {
        noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
      }
    }
  }
  else {
    local_21c = (undefined1  [4])iVar14;
    while (ref_s_pos1 < iVar17) {
      pAVar19 = local_228;
      noOverlapMergeBAM(local_228,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,1);
    }
    while (ref_s_pos1 <= iVar7) {
      pAVar19 = local_228;
      overlapMerge(local_228,(BamAlignment *)local_238,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                   ,&c_pos1,&c_pos2,&q_pos1,&q_pos2,&ref_s_pos1);
    }
    while (ref_s_pos1 <= (int)local_21c) {
      noOverlapMerge(pAVar19,(BamAlignment *)local_238,&dna,&qualities,&nucigar,&cigar_temp_unrolled
                     ,&c_pos2,&q_pos2,&ref_s_pos1);
    }
  }
  pAVar19 = local_228;
  uVar15 = *(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4) + 1;
  if (local_228->start1 <= uVar15) {
    uVar15 = local_228->start1;
  }
  local_228->start1 = uVar15;
  uVar9 = BamTools::BamAlignment::GetEndPosition(SUB81(local_238,0),false);
  uVar15 = pAVar19->end1;
  if (pAVar19->end1 < uVar9) {
    uVar15 = uVar9;
  }
  pAVar19->end1 = uVar15;
  pAVar19->single_end = true;
  createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&ref,&nucigar);
  pCVar3 = (pAVar19->cigar1).
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pAVar19->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
  (pAVar19->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
  (pAVar19->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ref.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ref.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3);
  }
  if (ref.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Var18._M_p = nucigar._M_dataplus._M_p;
  if (qualities._M_string_length == 0) {
    iVar14 = 0;
  }
  else {
    sVar13 = 0;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + qualities._M_dataplus._M_p[sVar13] + -0x21;
      sVar13 = sVar13 + 1;
    } while (qualities._M_string_length != sVar13);
  }
  pAVar19->phred_sum1 = iVar14;
  pcVar4 = (pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar4) {
    (pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  if (nucigar._M_string_length != 0) {
    sVar13 = 0;
    do {
      ref.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(ref.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                             .
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                             .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                             super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                             _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,_Var18._M_p[sVar13]);
      __position._M_current =
           (pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)this_00,__position,(char *)&ref);
      }
      else {
        *__position._M_current = _Var18._M_p[sVar13];
        ppcVar1 = &(pAVar19->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      sVar13 = sVar13 + 1;
    } while (nucigar._M_string_length != sVar13);
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_e8,this_00);
  iVar14 = *(int *)((long)&(local_238->sequence1).backward_qualities.pn.pi_ + 4);
  _Var18 = qualities._M_dataplus;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,qualities._M_dataplus._M_p,
             qualities._M_dataplus._M_p + qualities._M_string_length);
  referenceString(&ref,(AlignmentRecord *)_Var18._M_p,&local_e8,iVar14,&dna,&local_70,mainReference)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pAVar19->strand1 == false) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,dna._M_dataplus._M_p,dna._M_dataplus._M_p + dna._M_string_length)
    ;
    complement(&local_50,&local_90);
    ShortDnaSequence::ShortDnaSequence(&local_198,&local_50,&qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).forward,&local_198.forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).forward_qualities,&local_198.forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).backward,&local_198.backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).backward_qualities,&local_198.backward_qualities);
    ShortDnaSequence::~ShortDnaSequence(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p +
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_string_length);
    complement((string *)&local_198,&local_b0);
    std::__cxx11::string::operator=((string *)&pAVar19->reference_seq1,(string *)&local_198);
    psVar2 = &local_198.forward.pn;
    if ((shared_count *)local_198._vptr_ShortDnaSequence != psVar2) {
      operator_delete(local_198._vptr_ShortDnaSequence);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p,
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p +
               ref.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_string_length);
    complement((string *)&local_198,&local_d0);
    std::__cxx11::string::operator=((string *)&pAVar19->alignSequence1,(string *)&local_198);
    if ((shared_count *)local_198._vptr_ShortDnaSequence != psVar2) {
      operator_delete(local_198._vptr_ShortDnaSequence);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  else {
    ShortDnaSequence::ShortDnaSequence(&local_198,&dna,&qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).forward,&local_198.forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).forward_qualities,&local_198.forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).backward,&local_198.backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(pAVar19->sequence1).backward_qualities,&local_198.backward_qualities);
    ShortDnaSequence::~ShortDnaSequence(&local_198);
    std::__cxx11::string::_M_assign((string *)&pAVar19->reference_seq1);
    std::__cxx11::string::_M_assign((string *)&pAVar19->alignSequence1);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&pAVar19->qualityList1,(vector<int,_std::allocator<int>_> *)&ref);
  sVar10 = ShortDnaSequence::size(&pAVar19->sequence1);
  pAVar19->length_incl_deletions1 = (int)sVar10;
  sVar10 = ShortDnaSequence::size(&pAVar19->sequence1);
  pAVar19->length_incl_longdeletions1 = (int)sVar10;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_198,pAVar19);
  pmVar5 = (pAVar19->cov_pos).
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pAVar19->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_198._vptr_ShortDnaSequence;
  (pAVar19->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_198.forward.px;
  (pAVar19->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_198.forward.pn.pi_;
  local_198._vptr_ShortDnaSequence = (_func_int **)0x0;
  local_198.forward.px = (element_type *)0x0;
  local_198.forward.pn.pi_ = (sp_counted_base *)0x0;
  if (pmVar5 != (pointer)0x0) {
    operator_delete(pmVar5);
  }
  if (local_198._vptr_ShortDnaSequence != (_func_int **)0x0) {
    operator_delete(local_198._vptr_ShortDnaSequence);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &ref.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &ref.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (ref.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(ref.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cigar_temp_unrolled.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
    operator_delete(nucigar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualities._M_dataplus._M_p != &qualities.field_2) {
    operator_delete(qualities._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dna._M_dataplus._M_p != &dna.field_2) {
    operator_delete(dna._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AlignmentRecord::getMergedDnaSequence(const BamTools::BamAlignment& alignment,string & mainReference){
        std::string dna = "";
        std::string qualities = "";
        std::string nucigar = "";
        std::vector<char> cigar_temp_unrolled;
        //vector of CigarOp
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar_temp_unrolled.push_back(it.Type);
            }
        }
        //get starting position and ending position according to ref position, paying attention to clipped bases
        int offset_f1 = computeOffset(this->cigar1_unrolled);
        int offset_f2 = computeOffset(cigar_temp_unrolled);
        int offset_b1 = computeRevOffset(this->cigar1_unrolled);
        int offset_b2 = computeRevOffset(cigar_temp_unrolled);

        //updated ref position including clips
        int ref_s_pos1 = this->start1-offset_f1;
        int ref_e_pos1 = this->end1+offset_b1;
        int ref_s_pos2 = alignment.Position+1-offset_f2;
        int ref_e_pos2 = alignment.GetEndPosition()+offset_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_pos2 = 0;
        //4 cases of different overlaps
        //------------
        //     ------------
        if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos1);
            }
        }//------------------------------
            //           ----------
         else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
            while(ref_s_pos1<ref_s_pos2){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            while(ref_s_pos1<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1);
            }
            while(ref_s_pos1<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,1);
            }
            //         ----------
            //--------------------------
        } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            //           --------------------
            //---------------------
        } else {
            assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
            while(ref_s_pos2<ref_s_pos1){
                noOverlapMerge(alignment, dna, qualities, nucigar, cigar_temp_unrolled, c_pos2, q_pos2, ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos2){
                overlapMerge(alignment,dna,qualities,nucigar,cigar_temp_unrolled,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2);
            }
            while(ref_s_pos2<=ref_e_pos1){
                noOverlapMergeBAM(dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos2,1);
            }
        }
        this->start1 = std::min(this->start1,(unsigned int)alignment.Position+1);
        this->end1=std::max((unsigned int)alignment.GetEndPosition(),this->end1);
        this->single_end= true;
        this->cigar1 = createCigar(nucigar);

        this->phred_sum1=phred_sum(qualities);

        this->cigar1_unrolled.clear();
        for (char i : nucigar){
            this->cigar1_unrolled.push_back(i);
        }

        //NoMe Additions
        std::tuple<string,string,vector<int>> ref = referenceString(this->getCigar1Unrolled(),alignment.Position,dna,qualities,mainReference);
        if(!this->strand1){
           this->sequence1 = ShortDnaSequence(complement(dna), qualities);
           this->reference_seq1=complement(std::get<0>(ref));
           this->alignSequence1=complement(std::get<1>(ref));
            this->qualityList1 = std::get<2>(ref);
        }else{
           this->sequence1=ShortDnaSequence(dna,qualities);
           this->reference_seq1=std::get<0>(ref);
           this->alignSequence1=std::get<1>(ref);
            this->qualityList1 = std::get<2>(ref);
        }
        //fill out thr frs ffs thing here

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();
        //End NoMe Additions
        //this->strandInfo = this->determineStrand(this->alignSequence1,this->reference_seq1);
        this->cov_pos = this->coveredPositions();
}